

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

Shift dg::vr::RelationsAnalyzer::getShift(BinaryOperator *op,VectorSet<const_llvm::Value_*> *froms)

{
  bool bVar1;
  uint uVar2;
  BinaryOps BVar3;
  ret_type pLVar4;
  BinaryOps opcode;
  ret_type load;
  ConstantInt *c;
  V param;
  uint in_stack_ffffffffffffff7c;
  Value *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff94;
  BinaryOperator *in_stack_ffffffffffffffb0;
  Shift local_4;
  
  llvm::BinaryOperator::getOperand
            ((BinaryOperator *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  bVar1 = llvm::isa<llvm::ConstantInt,llvm::Value*>((Value **)0x1ce0dc);
  uVar2 = (uint)bVar1;
  llvm::BinaryOperator::getOperand
            ((BinaryOperator *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  bVar1 = llvm::isa<llvm::ConstantInt,llvm::Value*>((Value **)0x1ce103);
  if (uVar2 == bVar1) {
    local_4 = UNKNOWN;
  }
  else {
    getParams(in_stack_ffffffffffffffb0);
    std::tie<llvm::Value_const*,llvm::ConstantInt*>
              ((Value **)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
               (ConstantInt **)in_stack_ffffffffffffff80);
    std::tuple<llvm::Value_const*&,llvm::ConstantInt*&>::operator=
              ((tuple<const_llvm::Value_*&,_llvm::ConstantInt_*&> *)
               CONCAT44(in_stack_ffffffffffffff94,uVar2),
               (pair<llvm::Value_*,_llvm::ConstantInt_*> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    pLVar4 = llvm::dyn_cast<llvm::LoadInst,llvm::Value_const>(in_stack_ffffffffffffff80);
    bVar5 = 1;
    if (pLVar4 != (ret_type)0x0) {
      llvm::LoadInst::getPointerOperand((LoadInst *)0x1ce19d);
      bVar1 = VectorSet<llvm::Value_const*>::contains<llvm::Value_const*>
                        ((VectorSet<const_llvm::Value_*> *)CONCAT44(in_stack_ffffffffffffff94,uVar2)
                         ,(Value **)CONCAT17(bVar5,in_stack_ffffffffffffff88));
      bVar5 = bVar1 ^ 0xff;
    }
    if ((bVar5 & 1) == 0) {
      BVar3 = llvm::BinaryOperator::getOpcode((BinaryOperator *)0x1ce1db);
      if (((BVar3 == Add) && (bVar1 = llvm::ConstantInt::isOne((ConstantInt *)0x1ce1f0), bVar1)) ||
         ((BVar3 == Sub && (bVar1 = llvm::ConstantInt::isMinusOne((ConstantInt *)0x1ce205), bVar1)))
         ) {
        local_4 = INC;
      }
      else if (((BVar3 == Add) &&
               (bVar1 = llvm::ConstantInt::isMinusOne((ConstantInt *)0x1ce229), bVar1)) ||
              ((BVar3 == Sub && (bVar1 = llvm::ConstantInt::isOne((ConstantInt *)0x1ce23e), bVar1)))
              ) {
        local_4 = DEC;
      }
      else {
        local_4 = UNKNOWN;
      }
    }
    else {
      local_4 = UNKNOWN;
    }
  }
  return local_4;
}

Assistant:

RelationsAnalyzer::Shift
RelationsAnalyzer::getShift(const llvm::BinaryOperator *op,
                            const VectorSet<V> &froms) {
    if (llvm::isa<llvm::ConstantInt>(op->getOperand(0)) ==
        llvm::isa<llvm::ConstantInt>(op->getOperand(1)))
        return Shift::UNKNOWN;
    V param = nullptr;
    llvm::ConstantInt *c = nullptr;
    std::tie(param, c) = getParams(op);

    assert(param && c);
    auto load = llvm::dyn_cast<llvm::LoadInst>(param);
    if (!load || !froms.contains(load->getPointerOperand()))
        return Shift::UNKNOWN;

    auto opcode = op->getOpcode();
    if ((opcode == llvm::Instruction::Add && c->isOne()) ||
        (opcode == llvm::Instruction::Sub && c->isMinusOne())) {
        return Shift::INC;
    }
    if ((opcode == llvm::Instruction::Add && c->isMinusOne()) ||
        (opcode == llvm::Instruction::Sub && c->isOne())) {
        return Shift::DEC;
    }
    return Shift::UNKNOWN;
}